

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O1

void gz_uncompress(gzFile in,FILE *out)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  FILE *pFVar5;
  gzFile pgVar6;
  char *pcVar7;
  ulong unaff_RBP;
  char *pcVar8;
  char *pcVar9;
  FILE *__s;
  char *pcVar10;
  gzFile unaff_R12;
  bool bVar11;
  ulong uVar12;
  char *pcVar13;
  bool bVar14;
  int err;
  char buf [16384];
  undefined4 uStack_48c0;
  undefined1 uStack_48bc;
  char *pcStack_48a8;
  gzFile pgStack_48a0;
  undefined8 uStack_4880;
  char acStack_4878 [1032];
  FILE *pFStack_4470;
  char acStack_4450 [1024];
  gzFile pgStack_4050;
  FILE *pFStack_4048;
  code *pcStack_4040;
  char local_402c [4];
  char local_4028 [16392];
  
  pcVar13 = local_402c + 4;
  do {
    pcStack_4040 = (code *)0x101600;
    pcVar8 = pcVar13;
    uVar1 = gzread(in,pcVar13,0x4000);
    if ((int)uVar1 < 0) {
      pcVar8 = local_402c;
      pcStack_4040 = (code *)0x101656;
      __s = (FILE *)in;
      gz_uncompress_cold_4();
      goto LAB_00101656;
    }
    if (uVar1 == 0) goto LAB_00101623;
    unaff_RBP = (ulong)uVar1;
    pcVar8 = (char *)0x1;
    pcStack_4040 = (code *)0x10161a;
    sVar4 = fwrite(pcVar13,1,(ulong)uVar1,(FILE *)out);
  } while (uVar1 == (uint)sVar4);
  pcStack_4040 = (code *)0x101623;
  gz_uncompress_cold_1();
LAB_00101623:
  pcStack_4040 = (code *)0x10162b;
  __s = out;
  iVar2 = fclose((FILE *)out);
  if (iVar2 == 0) {
    pcStack_4040 = (code *)0x101637;
    __s = (FILE *)in;
    iVar2 = gzclose();
    if (iVar2 == 0) {
      return;
    }
  }
  else {
LAB_00101656:
    pcStack_4040 = (code *)0x10165b;
    gz_uncompress_cold_2();
  }
  pcStack_4040 = file_compress;
  gz_uncompress_cold_3();
  pcVar10 = acStack_4450;
  pcVar9 = pcVar8;
  pgStack_4050 = in;
  pFStack_4048 = out;
  pcStack_4040 = (code *)pcVar13;
  sVar4 = strlen((char *)__s);
  if (sVar4 - 0x3fd < 0xfffffffffffffc00) {
    file_compress_cold_3();
LAB_001016f1:
    pcVar8 = pcVar9;
    file_compress_cold_2();
  }
  else {
    snprintf(acStack_4450,0x400,"%s%s",__s,".gz");
    pcVar9 = "rb";
    pFVar5 = fopen((char *)__s,"rb");
    if (pFVar5 == (FILE *)0x0) goto LAB_001016f1;
    pgVar6 = (gzFile)gzopen(acStack_4450);
    if (pgVar6 != (gzFile)0x0) {
      gz_compress((FILE *)pFVar5,pgVar6);
      unlink((char *)__s);
      return;
    }
  }
  file_compress_cold_1();
  pcVar13 = acStack_4878;
  uStack_4880 = (code *)0x101717;
  pFStack_4470 = __s;
  sVar4 = strlen(pcVar10);
  if (sVar4 - 0x3fd < 0xfffffffffffffc00) {
    uStack_4880 = (code *)0x1017ee;
    file_uncompress_cold_3();
LAB_001017ee:
    pgVar6 = unaff_R12;
    uStack_4880 = (code *)0x1017f6;
    file_uncompress_cold_2();
  }
  else {
    unaff_R12 = (gzFile)0x400;
    uStack_4880 = (code *)0x10174e;
    snprintf(acStack_4878,0x400,"%s",pcVar10);
    if (sVar4 < 4) {
LAB_0010176c:
      unaff_R12 = (gzFile)(0x400 - sVar4);
      uStack_4880 = (code *)0x10178b;
      snprintf(acStack_4878 + sVar4,(size_t)unaff_R12,"%s",".gz");
      pcVar9 = acStack_4878;
      pcVar13 = pcVar10;
    }
    else {
      uStack_4880 = (code *)0x101768;
      iVar2 = strcmp(pcVar10 + (sVar4 - 3),".gz");
      if (iVar2 != 0) goto LAB_0010176c;
      acStack_4878[sVar4 - 3] = '\0';
      pcVar9 = pcVar10;
    }
    pcVar8 = "rb";
    uStack_4880 = (code *)0x10179d;
    pgVar6 = (gzFile)gzopen(pcVar9);
    if (pgVar6 == (gzFile)0x0) goto LAB_001017ee;
    pcVar8 = "wb";
    uStack_4880 = (code *)0x1017b4;
    pFVar5 = fopen(pcVar13,"wb");
    if (pFVar5 != (FILE *)0x0) {
      uStack_4880 = (code *)0x1017c4;
      gz_uncompress(pgVar6,(FILE *)pFVar5);
      uStack_4880 = (code *)0x1017cc;
      unlink(pcVar9);
      return;
    }
  }
  uStack_4880 = main;
  pcVar9 = pcVar10;
  file_uncompress_cold_1();
  uVar12 = (ulong)pcVar9 & 0xffffffff;
  uStack_48bc = 0;
  uStack_48c0 = 0x20366277;
  prog = *(char **)pcVar8;
  pcVar13 = *(char **)pcVar8;
  pcStack_48a8 = pcVar10;
  pgStack_48a0 = pgVar6;
  uStack_4880 = (code *)unaff_RBP;
  pcVar7 = strrchr(pcVar13,0x2f);
  pcVar10 = pcVar7 + 1;
  if (pcVar7 == (char *)0x0) {
    pcVar10 = pcVar13;
  }
  iVar2 = strcmp(pcVar10,"gunzip");
  if (iVar2 == 0) {
    bVar14 = true;
    bVar11 = false;
  }
  else {
    iVar2 = strcmp(pcVar10,"zcat");
    bVar14 = iVar2 == 0;
    bVar11 = bVar14;
  }
  pcVar8 = pcVar8 + 8;
  iVar2 = (int)pcVar9 + -1;
  if (1 < (int)pcVar9) {
    do {
      pcVar13 = *(char **)pcVar8;
      iVar3 = strcmp(pcVar13,"-c");
      if (iVar3 == 0) {
        bVar11 = true;
      }
      else {
        iVar3 = strcmp(pcVar13,"-d");
        if (iVar3 == 0) {
          bVar14 = true;
        }
        else {
          iVar3 = strcmp(pcVar13,"-f");
          if (iVar3 == 0) {
            uStack_48c0 = CONCAT13(0x66,(undefined3)uStack_48c0);
          }
          else {
            iVar3 = strcmp(pcVar13,"-h");
            if (iVar3 == 0) {
              uStack_48c0 = CONCAT13(0x68,(undefined3)uStack_48c0);
            }
            else {
              iVar3 = strcmp(pcVar13,"-r");
              if (iVar3 == 0) {
                uStack_48c0 = CONCAT13(0x52,(undefined3)uStack_48c0);
              }
              else {
                if (*pcVar13 != '-') {
                  iVar2 = (int)uVar12 + -1;
                  goto LAB_0010195b;
                }
                if ((8 < (byte)(pcVar13[1] - 0x31U)) || (pcVar13[2] != '\0')) goto LAB_0010195b;
                uStack_48c0._0_3_ = CONCAT12(pcVar13[1],(undefined2)uStack_48c0);
              }
            }
          }
        }
      }
      pcVar8 = pcVar8 + 8;
      iVar2 = iVar2 + -1;
      uVar1 = (int)uVar12 - 1;
      uVar12 = (ulong)uVar1;
    } while (1 < (int)uVar1);
    iVar2 = 0;
  }
LAB_0010195b:
  if (uStack_48c0._3_1_ == ' ') {
    uStack_48c0 = uStack_48c0 & 0xffffff;
  }
  if (iVar2 == 0) {
    if (bVar14) {
      iVar2 = fileno(_stdin);
      pgVar6 = (gzFile)gzdopen(iVar2,"rb");
      if (pgVar6 == (gzFile)0x0) {
LAB_00101aba:
        main_cold_3();
LAB_00101abf:
        main_cold_4();
        return;
      }
      gz_uncompress(pgVar6,(FILE *)_stdout);
    }
    else {
      iVar2 = fileno(_stdout);
      pgVar6 = (gzFile)gzdopen(iVar2,&uStack_48c0);
      if (pgVar6 == (gzFile)0x0) goto LAB_00101abf;
      gz_compress((FILE *)_stdin,pgVar6);
    }
  }
  else {
    do {
      pcVar13 = *(char **)pcVar8;
      if (bVar14) {
        if (bVar11) {
          pgVar6 = (gzFile)gzopen(pcVar13,"rb");
          if (pgVar6 == (gzFile)0x0) {
            main_cold_1();
          }
          else {
            gz_uncompress(pgVar6,(FILE *)_stdout);
          }
        }
        else {
          file_uncompress(pcVar13);
        }
      }
      else if (bVar11) {
        pFVar5 = fopen(pcVar13,"rb");
        if (pFVar5 == (FILE *)0x0) {
          perror(*(char **)pcVar8);
        }
        else {
          iVar3 = fileno(_stdout);
          pgVar6 = (gzFile)gzdopen(iVar3,&uStack_48c0);
          if (pgVar6 == (gzFile)0x0) {
            main_cold_2();
            goto LAB_00101aba;
          }
          gz_compress((FILE *)pFVar5,pgVar6);
        }
      }
      else {
        file_compress(pcVar13,(char *)&uStack_48c0);
      }
      pcVar8 = pcVar8 + 8;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

void gz_uncompress(in, out)
    gzFile in;
    FILE   *out;
{
    local char buf[BUFLEN];
    int len;
    int err;

    for (;;) {
        len = gzread(in, buf, sizeof(buf));
        if (len < 0) error (gzerror(in, &err));
        if (len == 0) break;

        if ((int)fwrite(buf, 1, (unsigned)len, out) != len) {
            error("failed fwrite");
        }
    }
    if (fclose(out)) error("failed fclose");

    if (gzclose(in) != Z_OK) error("failed gzclose");
}